

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatements
          (cmNinjaTargetGenerator *this,string *config,string *fileConfig,bool firstForConfig)

{
  pointer pcVar1;
  cmOSXBundleGenerator *pcVar2;
  cmMakefile *pcVar3;
  cmGeneratorTarget *pcVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  undefined8 uVar7;
  size_type sVar8;
  _Alloc_hider __first;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  pointer __last;
  bool bVar11;
  bool bVar12;
  int iVar13;
  TargetType targetType;
  PolicyStatus PVar14;
  cmGlobalNinjaGenerator *pcVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar16;
  ostream *poVar17;
  mapped_type *pmVar18;
  cmValue cVar19;
  cmGlobalNinjaGenerator *pcVar20;
  string *psVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar23;
  cmSourceFile *pcVar24;
  cmFileSet *pcVar25;
  MapToNinjaPathImpl MVar26;
  ulong uVar27;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var28;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string *psVar29;
  const_iterator cVar30;
  vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
  *this_00;
  undefined4 extraout_var_03;
  _Base_ptr p_Var31;
  undefined4 extraout_var_04;
  undefined7 in_register_00000009;
  iterator it;
  pointer ppcVar32;
  long lVar33;
  iterator iVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  pointer pbVar36;
  _Rb_tree_node_base *p_Var37;
  cmCustomCommand *pcVar38;
  _Base_ptr __x;
  _Base_ptr p_Var39;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  basic_string_view<char,_std::char_traits<char>_> __str;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> swiftSources;
  string tgtDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccouts;
  vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommandSources;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccouts_private;
  cmNinjaTargetGenerator *pcVar40;
  cmNinjaTargetGenerator *pcVar41;
  undefined1 local_4a8 [16];
  undefined1 local_498 [48];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  *local_468;
  _Rb_tree_node_base *local_460;
  string local_458;
  undefined4 local_434;
  undefined1 local_430 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  _Rb_tree_node_base *local_3b8;
  iterator iStack_3b0;
  cmCustomCommand **local_3a8;
  _Rb_tree_node_base *local_3a0;
  undefined1 local_398 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  _Alloc_hider local_370;
  undefined1 local_368 [8];
  undefined1 auStack_360 [16];
  _Alloc_hider local_350;
  pointer local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  cmLocalGenerator *local_330;
  pointer local_328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_2f8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  iterator local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [5];
  undefined1 local_238 [32];
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  pointer local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  pointer local_1c8;
  _Base_ptr local_1c0;
  pointer local_1b8;
  pointer local_1b0;
  pointer local_1a8;
  pointer local_1a0;
  pointer local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  iterator local_178;
  _Rb_tree_node_base local_160;
  size_t local_140;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  undefined1 local_100 [32];
  char local_e0;
  string local_d8;
  string local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  
  local_434 = (undefined4)CONCAT71(in_register_00000009,firstForConfig);
  cmGeneratorTarget::CheckCxxModuleStatus
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  iVar13 = (*(pcVar15->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x45])(pcVar15,fileConfig);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)CONCAT44(extraout_var,iVar13));
  pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  iVar13 = (*(pcVar15->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x45])(pcVar15,fileConfig);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(extraout_var_00,iVar13),"# Object build statements for ",0x1e);
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  psVar16 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)CONCAT44(extraout_var_00,iVar13),(psVar16->_M_dataplus)._M_p,
                       psVar16->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," target ",8);
  psVar16 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_398._0_8_ = local_398 + 0x10;
  pcVar1 = (psVar16->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_398,pcVar1,pcVar1 + psVar16->_M_string_length);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(char *)local_398._0_8_,local_398._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n\n",2);
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  local_3a8 = (cmCustomCommand **)0x0;
  local_3b8 = (_Rb_tree_node_base *)0x0;
  iStack_3b0._M_current = (cmCustomCommand **)0x0;
  local_398._16_8_ = (pointer)0x0;
  local_398._0_8_ = (pointer)0x0;
  local_398._8_8_ = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_398,config
            );
  uVar7 = local_398._8_8_;
  if (local_398._0_8_ != local_398._8_8_) {
    ppcVar32 = (pointer)local_398._0_8_;
    do {
      local_238._0_8_ = cmSourceFile::GetCustomCommand(*ppcVar32);
      cmLocalNinjaGenerator::AddCustomCommandTarget
                (this->LocalGenerator,(cmCustomCommand *)local_238._0_8_,
                 (this->super_cmCommonTargetGenerator).GeneratorTarget);
      if (iStack_3b0._M_current == local_3a8) {
        std::vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>>::
        _M_realloc_insert<cmCustomCommand_const*const&>
                  ((vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>> *)
                   &local_3b8,iStack_3b0,(cmCustomCommand **)local_238);
      }
      else {
        *iStack_3b0._M_current = (cmCustomCommand *)local_238._0_8_;
        iStack_3b0._M_current = iStack_3b0._M_current + 1;
      }
      ppcVar32 = ppcVar32 + 1;
    } while (ppcVar32 != (pointer)uVar7);
  }
  psVar16 = config;
  if ((pointer)local_398._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ - local_398._0_8_);
  }
  local_398._0_8_ = (pointer)0x0;
  local_398._8_8_ = (pointer)0x0;
  local_398._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_398,config
            );
  pcVar2 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  local_468 = &this->Configs;
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_468,fileConfig);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_398
             ,&((pmVar18->MacOSXContentGenerator)._M_t.
                super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
               _M_head_impl)->super_MacOSXContentGeneratorType,config);
  if ((pointer)local_398._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ - local_398._0_8_);
  }
  local_398._0_8_ = (pointer)0x0;
  local_398._8_8_ = (pointer)0x0;
  local_398._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_398,config
            );
  pcVar2 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_468,fileConfig);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_398
             ,&((pmVar18->MacOSXContentGenerator)._M_t.
                super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
               _M_head_impl)->super_MacOSXContentGeneratorType,config);
  if ((pointer)local_398._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ - local_398._0_8_);
  }
  pcVar40 = this;
  if ((char)local_434 != '\0') {
    pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
    local_398._0_8_ = local_398 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"CMAKE_PCH_EXTENSION","");
    cVar19 = cmMakefile::GetDefinition(pcVar3,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
    }
    local_238._0_8_ = (cmCustomCommand *)0x0;
    local_238._8_8_ = (cmCustomCommand *)0x0;
    local_238._16_8_ = (pointer)0x0;
    cmGeneratorTarget::GetExternalObjects
              ((this->super_cmCommonTargetGenerator).GeneratorTarget,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_238,
               config);
    uVar7 = local_238._8_8_;
    this = pcVar40;
    if (local_238._0_8_ != local_238._8_8_) {
      pcVar38 = (cmCustomCommand *)local_238._0_8_;
      config = psVar16;
      do {
        pcVar24 = (cmSourceFile *)
                  (pcVar38->Outputs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
        psVar16 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar24);
        pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
        psVar16 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar20,psVar16);
        (*(pcVar15->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x18])((value_type *)local_398,pcVar15,psVar16,config);
        local_4a8._0_8_ = local_398._8_8_;
        local_4a8._8_8_ = local_398._0_8_;
        if (cVar19.Value == (string *)0x0) {
LAB_004e895c:
          pmVar18 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                    ::operator[](local_468,config);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pmVar18->Objects,(value_type *)local_398);
        }
        else {
          ppcVar32 = (pointer)(cVar19.Value)->_M_string_length;
          if (((ulong)local_398._8_8_ < ppcVar32) ||
             (__str._M_str = ((cVar19.Value)->_M_dataplus)._M_p, __str._M_len = (size_t)ppcVar32,
             iVar13 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_4a8,
                                 local_398._8_8_ - (long)ppcVar32,(size_type)ppcVar32,__str),
             iVar13 != 0)) goto LAB_004e895c;
        }
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
        }
        pcVar38 = (cmCustomCommand *)
                  &(pcVar38->Outputs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        psVar16 = config;
        this = pcVar40;
      } while (pcVar38 != (cmCustomCommand *)uVar7);
    }
    pcVar40 = this;
    if ((cmCustomCommand *)local_238._0_8_ != (cmCustomCommand *)0x0) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ - local_238._0_8_);
    }
  }
  pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  bVar11 = cmGlobalNinjaGenerator::SupportsCWDDepend(pcVar15);
  if (!bVar11) {
    GetObjectFileDir((string *)local_398,this,config);
    EnsureDirectoryExists(this,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
    }
  }
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"phony","");
  local_238._0_8_ = local_238 + 0x10;
  local_238._8_8_ = (pointer)0x0;
  local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
  local_218._M_p = (pointer)&local_208;
  if (local_78 == &local_68) {
    local_208._8_8_ = local_68._8_8_;
  }
  else {
    local_218._M_p = (pointer)local_78;
  }
  local_208._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_208._M_local_buf[0] = local_68._M_local_buf[0];
  local_210 = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_160._M_color = _S_red;
  local_160._M_parent = (_Base_ptr)0x0;
  local_78 = &local_68;
  memset(&local_1f8,0,0x90);
  local_140 = 0;
  local_138._M_p = (pointer)&local_128;
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_160._M_left = &local_160;
  local_160._M_right = &local_160;
  psVar21 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar1 = (psVar21->_M_dataplus)._M_p;
  local_430._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_430 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_430,pcVar1,pcVar1 + psVar21->_M_string_length);
  local_398._0_8_ = &DAT_0000001c;
  local_398._8_8_ = "Order-only phony target for ";
  local_398._16_8_ = (pointer)0x0;
  local_380._0_8_ = local_430._8_8_;
  local_380._8_8_ = local_430._0_8_;
  views._M_len = 2;
  views._M_array = (iterator)local_398;
  local_370._M_p = (pointer)local_430;
  cmCatViews((string *)local_4a8,views);
  std::__cxx11::string::operator=((string *)local_238,(string *)local_4a8);
  if ((undefined1 *)local_4a8._0_8_ != local_498) {
    operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_430 + 0x10)) {
    operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
  }
  pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar15->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (local_398,pcVar15,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             local_1f8._M_local_buf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  local_3f8.field_2._0_8_ = 0;
  local_3f8._M_dataplus._M_p = (pointer)0x0;
  local_3f8._M_string_length = 0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar11 = cmTarget::HasFileSets(((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
  local_460 = (_Rb_tree_node_base *)CONCAT71(local_460._1_7_,1);
  if (bVar11) {
    PVar14 = cmPolicies::PolicyMap::Get
                       (&((this->super_cmCommonTargetGenerator).GeneratorTarget)->PolicyMap,CMP0154)
    ;
    local_460 = (_Rb_tree_node_base *)
                CONCAT71(local_460._1_7_,PVar14 + ~REQUIRED_ALWAYS < 0xfffffffd);
  }
  local_3a0 = (_Rb_tree_node_base *)iStack_3b0._M_current;
  if (local_3b8 != (_Rb_tree_node_base *)iStack_3b0._M_current) {
    p_Var37 = local_3b8;
    do {
      pcVar38 = *(cmCustomCommand **)p_Var37;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      pcVar1 = (psVar16->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar1,pcVar1 + psVar16->_M_string_length);
      local_e0 = '\0';
      local_58._M_p = (pointer)0x0;
      uStack_50 = 0;
      local_48 = (code *)0x0;
      uStack_40 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = psVar16;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_58;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)pcVar40;
      computeInternalDepfile._M_invoker = (_Invoker_type)fileConfig;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_398,pcVar38,&local_d8,
                 (cmLocalGenerator *)pcVar40->LocalGenerator,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       *)local_100)->_M_value,computeInternalDepfile);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      if ((local_e0 == '\x01') &&
         (local_e0 = '\0',
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_100._0_8_ !=
         &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             *)local_100)->_M_value).field_2)) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      pvVar22 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                          ((cmCustomCommandGenerator *)local_398);
      pvVar23 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)local_398);
      lVar33 = local_3f8._M_string_length - (long)local_3f8._M_dataplus._M_p;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
                 local_3f8._M_string_length,
                 (pvVar22->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar22->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
                 local_3f8._M_string_length,
                 (pvVar23->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar23->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      iVar34._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_3f8._M_dataplus._M_p + lVar33);
      if (iVar34._M_current !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_3f8._M_string_length && (char)local_460 == '\0') {
        do {
          pcVar4 = (pcVar40->super_cmCommonTargetGenerator).GeneratorTarget;
          pcVar24 = cmMakefile::GetOrCreateGeneratedSource
                              ((pcVar40->super_cmCommonTargetGenerator).Makefile,iVar34._M_current);
          pcVar25 = cmGeneratorTarget::GetFileSetForSource(pcVar4,psVar16,pcVar24);
          if (pcVar25 == (cmFileSet *)0x0) {
LAB_004e8e91:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_118,iVar34._M_current);
LAB_004e8ea1:
            iVar34 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::_M_erase(&local_3f8,iVar34);
          }
          else {
            bVar11 = cmFileSetVisibilityIsForInterface(pcVar25->Visibility);
            bVar12 = cmFileSetTypeCanBeIncluded(&pcVar25->Type);
            if (!bVar11 || !bVar12) {
              if (bVar12) goto LAB_004e8e91;
              goto LAB_004e8ea1;
            }
            iVar34._M_current = iVar34._M_current + 1;
          }
        } while (iVar34._M_current !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3f8._M_string_length);
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_398);
      p_Var37 = (_Rb_tree_node_base *)&p_Var37->_M_parent;
    } while (p_Var37 != local_3a0);
  }
  pcVar41 = pcVar40;
  cmLocalNinjaGenerator::AppendTargetDepends
            (pcVar40->LocalGenerator,(pcVar40->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_180,psVar16,fileConfig,DependOnTargetOrdering);
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_468,psVar16);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_180,
             local_178._M_current,
             (pmVar18->ExtraFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pmVar18->ExtraFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  sVar8 = local_3f8._M_string_length;
  __first._M_p = local_3f8._M_dataplus._M_p;
  MVar26.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_p,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_180,MVar26);
  iVar34._M_current = local_178._M_current;
  pbVar10 = local_180;
  if (local_180 != local_178._M_current) {
    uVar27 = (long)local_178._M_current - (long)local_180 >> 5;
    lVar33 = 0x3f;
    if (uVar27 != 0) {
      for (; uVar27 >> lVar33 == 0; lVar33 = lVar33 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_180,local_178._M_current,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar10,iVar34._M_current);
  }
  _Var28 = std::
           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (local_180,local_178._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_180,(iterator)_Var28._M_current,local_178);
  if (local_180 == local_178._M_current) {
    local_430._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_430._16_8_ = local_430._16_8_ & 0xffffffffffffff00;
    local_430._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_430 + 0x10);
    pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
    bVar11 = cmGlobalNinjaGenerator::SupportsCWDDepend(pcVar15);
    if (bVar11) {
      std::__cxx11::string::_M_replace((ulong)local_430,0,(char *)local_430._8_8_,0x9169ed);
    }
    else {
      psVar21 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)pcVar40->LocalGenerator);
      (*(pcVar40->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[0x10])
                (&local_3d8,pcVar40->LocalGenerator,
                 (pcVar40->super_cmCommonTargetGenerator).GeneratorTarget);
      local_398._8_8_ = (psVar21->_M_dataplus)._M_p;
      local_398._0_8_ = psVar21->_M_string_length;
      local_398._16_8_ = (pointer)0x0;
      local_498._0_8_ = local_498 + 8;
      local_4a8._0_8_ = (pointer)0x0;
      local_4a8._8_8_ = (pointer)0x1;
      local_498[8] = '/';
      local_380._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_370._M_p = (pointer)0x0;
      local_368 = (undefined1  [8])local_3d8._M_string_length;
      auStack_360._0_8_ = local_3d8._M_dataplus._M_p;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_398;
      local_380._8_8_ = local_498._0_8_;
      auStack_360._8_8_ = &local_3d8;
      cmCatViews(&local_458,views_00);
      std::__cxx11::string::operator=((string *)local_430,(string *)&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._0_8_ + 1);
      }
    }
    pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
    psVar21 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar15,(string *)local_430);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_180,psVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_430 + 0x10)) {
      operator_delete((void *)local_430._0_8_,(ulong)(local_430._16_8_ + 1));
    }
  }
  pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
  pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
  iVar13 = (*(pcVar20->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x45])(pcVar20,fileConfig);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar15,(ostream *)CONCAT44(extraout_var_01,iVar13),(cmNinjaBuild *)local_238,0,
             (bool *)0x0);
  pcVar40->HasPrivateGeneratedSources =
       local_118.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_118.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"phony","");
    local_380._8_8_ = local_368;
    local_398._0_8_ = local_398 + 0x10;
    local_398._8_8_ = (pointer)0x0;
    local_398._16_8_ = local_398._16_8_ & 0xffffffffffffff00;
    if (local_98 == &local_88) {
      auStack_360._0_8_ = local_88._8_8_;
    }
    else {
      local_380._8_8_ = local_98;
    }
    local_368._1_7_ = local_88._M_allocated_capacity._1_7_;
    local_368[0] = local_88._M_local_buf[0];
    local_370._M_p = (pointer)local_90;
    local_90 = (string *)0x0;
    local_88._M_local_buf[0] = '\0';
    local_2c0._M_dataplus._M_p._0_4_ = _S_red;
    local_2c0._M_string_length = 0;
    local_98 = &local_88;
    memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(auStack_360 + 8),0,
           0x90);
    local_2a0 = 0;
    local_298._M_allocated_capacity = (size_type)local_288;
    local_298._8_8_ = 0;
    local_288[0]._M_local_buf[0] = '\0';
    local_2c0.field_2._M_allocated_capacity = (size_type)&local_2c0;
    local_2c0.field_2._8_8_ = &local_2c0;
    pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
    (*(pcVar15->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49]
    )(local_4a8,pcVar15,(pcVar40->super_cmCommonTargetGenerator).GeneratorTarget,psVar16);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8);
    if ((undefined1 *)local_4a8._0_8_ != local_498) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
    }
    pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
    cmGlobalNinjaGenerator::OrderDependsTargetForTargetPrivate
              ((string *)local_4a8,pcVar15,(pcVar40->super_cmCommonTargetGenerator).GeneratorTarget,
               psVar16);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (auStack_360 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8);
    if ((undefined1 *)local_4a8._0_8_ != local_498) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
    }
    __last = local_118.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar36 = local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar26.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar36,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_2e0,MVar26);
    iVar34._M_current = local_2d8._M_current;
    pbVar10 = local_2e0;
    if (local_2e0 != local_2d8._M_current) {
      uVar27 = (long)local_2d8._M_current - (long)local_2e0 >> 5;
      lVar33 = 0x3f;
      if (uVar27 != 0) {
        for (; uVar27 >> lVar33 == 0; lVar33 = lVar33 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_2e0,local_2d8._M_current,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar10,iVar34._M_current);
    }
    _Var28 = std::
             __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (local_2e0,local_2d8._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2e0,(iterator)_Var28._M_current,local_2d8);
    pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
    pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
    iVar13 = (*(pcVar20->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[0x45])(pcVar20,fileConfig);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar15,(ostream *)CONCAT44(extraout_var_02,iVar13),(cmNinjaBuild *)local_398,0,
               (bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_398);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_3f8);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_238);
  local_238._0_8_ = (cmCustomCommand *)0x0;
  local_238._8_8_ = (cmCustomCommand *)0x0;
  local_238._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((pcVar40->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_238,
             psVar16);
  uVar7 = local_238._8_8_;
  local_4a8._0_8_ = (pointer)0x0;
  local_4a8._8_8_ = (cmSourceFile **)0x0;
  local_498._0_8_ = (cmSourceFile **)0x0;
  bVar11 = (bool)(char)local_434;
  if (local_238._0_8_ != local_238._8_8_) {
    pcVar38 = (cmCustomCommand *)local_238._0_8_;
    do {
      local_430._0_8_ =
           (pcVar38->Outputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      bVar12 = cmLocalGenerator::IsSplitSwiftBuild((cmLocalGenerator *)pcVar41->LocalGenerator);
      if (bVar12) {
        cmSourceFile::GetLanguage_abi_cxx11_((string *)local_398,(cmSourceFile *)local_430._0_8_);
        iVar13 = std::__cxx11::string::compare((char *)local_398);
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
        }
        if (iVar13 != 0) goto LAB_004e955e;
        if (local_4a8._8_8_ == local_498._0_8_) {
          std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>::
          _M_realloc_insert<cmSourceFile_const*const&>
                    ((vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *)local_4a8,
                     (iterator)local_4a8._8_8_,(cmSourceFile **)local_430);
        }
        else {
          *(undefined8 *)local_4a8._8_8_ = local_430._0_8_;
          local_4a8._8_8_ = local_4a8._8_8_ + 8;
        }
      }
      else {
LAB_004e955e:
        WriteObjectBuildStatement(pcVar41,(cmSourceFile *)local_430._0_8_,psVar16,fileConfig,bVar11)
        ;
      }
      pcVar38 = (cmCustomCommand *)
                &(pcVar38->Outputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (pcVar38 != (cmCustomCommand *)uVar7);
  }
  psVar21 = psVar16;
  pcVar40 = pcVar41;
  WriteSwiftObjectBuildStatement
            (pcVar41,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     local_4a8,psVar16,fileConfig,bVar11);
  if ((pointer)local_4a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_4a8._0_8_,local_498._0_8_ - local_4a8._0_8_);
  }
  if ((cmCustomCommand *)local_238._0_8_ != (cmCustomCommand *)0x0) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ - local_238._0_8_);
  }
  local_398._0_8_ = (pointer)0x0;
  local_398._8_8_ = (pointer)0x0;
  local_398._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetCxxModuleSources
            ((pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_398,
             psVar16);
  uVar7 = local_398._8_8_;
  for (ppcVar32 = (pointer)local_398._0_8_; ppcVar32 != (pointer)uVar7; ppcVar32 = ppcVar32 + 1) {
    WriteCxxModuleBmiBuildStatement(pcVar41,*ppcVar32,psVar16,fileConfig,bVar11);
  }
  if ((pointer)local_398._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ - local_398._0_8_);
  }
  local_4a8._0_8_ = (char *)0x0;
  local_4a8._8_8_ = (pointer)0x0;
  local_498._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  cmGeneratorTarget::GetSourceFiles
            ((pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_4a8,psVar16);
  uVar7 = local_4a8._8_8_;
  for (ppcVar32 = (pointer)local_4a8._0_8_; ppcVar32 != (pointer)uVar7; ppcVar32 = ppcVar32 + 1) {
    pcVar24 = *ppcVar32;
    pcVar25 = cmGeneratorTarget::GetFileSetForSource
                        ((pcVar40->super_cmCommonTargetGenerator).GeneratorTarget,psVar21,pcVar24);
    if (((pcVar25 != (cmFileSet *)0x0) && ((pcVar25->Type)._M_string_length == 0xb)) &&
       (plVar5 = (long *)(pcVar25->Type)._M_dataplus._M_p,
       *(long *)((long)plVar5 + 3) == 0x53454c55444f4d5f && *plVar5 == 0x55444f4d5f585843)) {
      cmSourceFile::GetLanguage_abi_cxx11_((string *)local_398,pcVar24);
      uVar9 = local_398._8_8_;
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      }
      if ((pointer)uVar9 == (pointer)0x0) {
        pcVar4 = (pcVar40->super_cmCommonTargetGenerator).GeneratorTarget;
        pcVar3 = pcVar4->Makefile;
        psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
        psVar29 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar24);
        local_398._0_8_ = (pointer)0x8;
        local_398._8_8_ = "Target \"";
        local_398._16_8_ = (pointer)0x0;
        local_380._8_8_ = (psVar16->_M_dataplus)._M_p;
        local_380._M_allocated_capacity = psVar16->_M_string_length;
        local_370._M_p = (pointer)0x0;
        local_368 = (undefined1  [8])&DAT_00000014;
        auStack_360._0_8_ = "\" has source file\n  ";
        auStack_360._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
        ;
        local_348 = (pointer)(psVar29->_M_dataplus)._M_p;
        local_350._M_p = (pointer)psVar29->_M_string_length;
        local_340._M_allocated_capacity = 0;
        local_340._8_8_ = 0x4a;
        local_330 = (cmLocalGenerator *)0x946fe7;
        local_328 = (pointer)0x0;
        views_01._M_len = 5;
        views_01._M_array = (iterator)local_398;
        cmCatViews((string *)local_238,views_01);
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_238);
        if ((cmCustomCommand *)local_238._0_8_ != (cmCustomCommand *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
      }
    }
    pcVar41 = pcVar40;
  }
  psVar16 = psVar21;
  if ((char *)local_4a8._0_8_ != (char *)0x0) {
    operator_delete((void *)local_4a8._0_8_,local_498._0_8_ - local_4a8._0_8_);
  }
  bVar11 = cmGeneratorTarget::HaveFortranSources
                     ((pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,psVar21);
  if (bVar11) {
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
              ::operator[](local_468,psVar21);
    local_398._0_8_ = local_398 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Fortran","");
    cVar30 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
             ::find(&(pmVar18->ScanningInfo)._M_t,(key_type *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
    }
    if ((_Rb_tree_header *)cVar30._M_node ==
        &(pmVar18->ScanningInfo)._M_t._M_impl.super__Rb_tree_header) {
      local_398._0_8_ = local_398 + 0x10;
      local_398._8_8_ = (pointer)0x0;
      local_398._16_8_ = local_398._16_8_ & 0xffffffffffffff00;
      local_370._M_p = (pointer)0x0;
      local_368 = (undefined1  [8])((ulong)local_368 & 0xffffffffffffff00);
      local_380._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_368;
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                ::operator[](local_468,psVar21);
      local_238._0_8_ = local_238 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Fortran","");
      this_00 = (vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
                   ::operator[](&pmVar18->ScanningInfo,(key_type *)local_238);
      std::
      vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
      ::emplace_back<cmNinjaTargetGenerator::ScanningFiles&>(this_00,(ScanningFiles *)local_398);
      if ((cmCustomCommand *)local_238._0_8_ != (cmCustomCommand *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      local_238._0_8_ = local_238 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Fortran","");
      WriteCompileRule(pcVar41,(string *)local_238,psVar21,Yes);
      if ((cmCustomCommand *)local_238._0_8_ != (cmCustomCommand *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368) {
        operator_delete((void *)local_380._8_8_,(ulong)((long)local_368 + 1));
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
      }
    }
  }
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_468,psVar21);
  p_Var31 = (pmVar18->ScanningInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var37 = &(pmVar18->ScanningInfo)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var31 != p_Var37) {
    do {
      local_3a0 = p_Var37;
      LanguageDyndepRule(&local_b8,pcVar40,(string *)(p_Var31 + 1),psVar16);
      local_398._0_8_ = local_398 + 0x10;
      local_398._8_8_ = (pointer)0x0;
      local_398._16_8_ = local_398._16_8_ & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        auStack_360._0_8_ = local_b8.field_2._8_8_;
        local_380._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_368;
      }
      else {
        local_380._8_8_ = local_b8._M_dataplus._M_p;
      }
      local_368._1_7_ = local_b8.field_2._M_allocated_capacity._1_7_;
      local_368[0] = local_b8.field_2._M_local_buf[0];
      local_370._M_p = (pointer)local_b8._M_string_length;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_2c0._M_dataplus._M_p._0_4_ = _S_red;
      local_2c0._M_string_length = 0;
      local_460 = p_Var31 + 1;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(auStack_360 + 8),
             0,0x90);
      local_2c0.field_2._M_allocated_capacity = (size_type)&local_2c0;
      local_2a0 = 0;
      local_298._M_allocated_capacity = (size_type)local_288;
      local_298._8_8_ = 0;
      local_288[0]._M_local_buf[0] = '\0';
      local_2c0.field_2._8_8_ = local_2c0.field_2._M_allocated_capacity;
      GetDyndepFilePath((string *)local_238,pcVar40,(string *)local_460,psVar16);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (auStack_360 + 8),(string *)local_238);
      psVar21 = psVar16;
      if ((cmCustomCommand *)local_238._0_8_ != (cmCustomCommand *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        psVar21 = psVar16;
      }
      pcVar41 = pcVar40;
      psVar16 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                          ((pcVar40->super_cmCommonTargetGenerator).Makefile);
      (*(pcVar40->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[0x10])
                (&local_3d8,pcVar40->LocalGenerator,
                 (pcVar40->super_cmCommonTargetGenerator).GeneratorTarget);
      pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
      (*(pcVar15->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x4d])(&local_3f8,pcVar15,psVar21);
      local_238._8_8_ = (psVar16->_M_dataplus)._M_p;
      local_238._0_8_ = psVar16->_M_string_length;
      local_238._16_8_ = (pointer)0x0;
      local_4a8._0_8_ = (char *)0x0;
      local_4a8._8_8_ = (pointer)0x1;
      local_498._0_8_ = local_498 + 8;
      local_498[8] = '/';
      local_238._24_8_ = 1;
      local_210 = 0;
      local_208._M_allocated_capacity = local_3d8._M_string_length;
      local_208._8_8_ = local_3d8._M_dataplus._M_p;
      local_1f8._M_allocated_capacity = (size_type)&local_3d8;
      local_1f8._8_8_ = local_3f8._M_string_length;
      local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p;
      local_430._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_430._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_430._16_8_ = &local_418;
      local_418._M_dataplus._M_p._0_1_ = '/';
      local_1d8 = (pointer)0x1;
      local_1c8 = (pointer)0x0;
      local_1b8 = *(pointer *)(p_Var31 + 1);
      local_1c0 = p_Var31[1]._M_parent;
      local_1b0 = (pointer)0x0;
      local_1a8 = (pointer)0xc;
      local_1a0 = (pointer)0x945d0e;
      local_198 = (pointer)0x0;
      views_02._M_len = 7;
      views_02._M_array = (iterator)local_238;
      local_218._M_p = (pointer)local_498._0_8_;
      local_1e0 = &local_3f8;
      local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_430._16_8_;
      cmCatViews(&local_458,views_02);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_340._M_local_buf,&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._0_8_ + 1);
      }
      GetTargetDependInfoPath((string *)local_238,pcVar41,(string *)local_460,psVar21);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_2f8,(string *)local_238);
      if ((cmCustomCommand *)local_238._0_8_ != (cmCustomCommand *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      p_Var6 = p_Var31[2]._M_parent;
      if (*(_Base_ptr *)(p_Var31 + 2) != p_Var6) {
        __x = *(_Base_ptr *)(p_Var31 + 2) + 1;
        do {
          if (__x[-1]._M_parent != (_Base_ptr)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_310,(value_type *)(__x + -1));
          }
          if (__x->_M_parent != (_Base_ptr)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_340,(value_type *)__x);
          }
          p_Var39 = __x + 1;
          __x = __x + 2;
        } while (p_Var39 != p_Var6);
      }
      p_Var37 = local_460;
      psVar16 = psVar21;
      pcVar40 = pcVar41;
      WriteTargetDependInfo(pcVar41,(string *)local_460,psVar21);
      cmCommonTargetGenerator::GetLinkedTargetDirectories
                ((LinkedTargetDirs *)local_430,&pcVar41->super_cmCommonTargetGenerator,
                 (string *)p_Var37,psVar21);
      uVar7 = local_430._8_8_;
      for (paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_430._0_8_; sVar8 = local_418._M_string_length,
          paVar35 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7; paVar35 = paVar35 + 2) {
        local_238._8_8_ = paVar35->_M_allocated_capacity;
        local_238._0_8_ = *(undefined8 *)((long)paVar35 + 8);
        local_238._16_8_ = (pointer)0x0;
        local_4a8._0_8_ = (char *)0x0;
        local_4a8._8_8_ = (pointer)0x1;
        local_498._0_8_ = local_498 + 8;
        local_498[8] = '/';
        local_238._24_8_ = 1;
        local_210 = 0;
        local_208._8_8_ = *(undefined8 *)(p_Var31 + 1);
        local_208._M_allocated_capacity = (size_type)p_Var31[1]._M_parent;
        local_1f8._M_allocated_capacity = 0;
        local_1f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
        local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x945d0e;
        local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_03._M_len = 4;
        views_03._M_array = (iterator)local_238;
        local_218._M_p = (pointer)local_498._0_8_;
        cmCatViews(&local_458,views_03);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_2f8,&local_458);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._0_8_ + 1);
        }
      }
      for (pbVar36 = (pointer)CONCAT71(local_418._M_dataplus._M_p._1_7_,
                                       local_418._M_dataplus._M_p._0_1_); pbVar36 != (pointer)sVar8;
          pbVar36 = pbVar36 + 1) {
        local_238._8_8_ = (pbVar36->_M_dataplus)._M_p;
        local_238._0_8_ = pbVar36->_M_string_length;
        local_238._16_8_ = (pointer)0x0;
        local_4a8._0_8_ = (char *)0x0;
        local_4a8._8_8_ = (pointer)0x1;
        local_498._0_8_ = local_498 + 8;
        local_498[8] = '/';
        local_238._24_8_ = 1;
        local_210 = 0;
        local_208._8_8_ = *(undefined8 *)(p_Var31 + 1);
        local_208._M_allocated_capacity = (size_type)p_Var31[1]._M_parent;
        local_1f8._M_allocated_capacity = 0;
        local_1f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
        local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x945d0e;
        local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_04._M_len = 4;
        views_04._M_array = (iterator)local_238;
        local_218._M_p = (pointer)local_498._0_8_;
        cmCatViews(&local_458,views_04);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_2f8,&local_458);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._0_8_ + 1);
        }
      }
      pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
      pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
      iVar13 = (*(pcVar20->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator[0x45])(pcVar20,fileConfig);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar15,(ostream *)CONCAT44(extraout_var_03,iVar13),(cmNinjaBuild *)local_398,0,
                 (bool *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_418);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_430);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_398);
      p_Var31 = (_Base_ptr)std::_Rb_tree_increment(p_Var31);
      p_Var37 = local_3a0;
    } while (p_Var31 != local_3a0);
  }
  pcVar15 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
  iVar13 = (*(pcVar15->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x45])(pcVar15,fileConfig);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(extraout_var_04,iVar13),"\n",1);
  if (local_3b8 != (_Rb_tree_node_base *)0x0) {
    operator_delete(local_3b8,(long)local_3a8 - (long)local_3b8);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatements(
  const std::string& config, const std::string& fileConfig,
  bool firstForConfig)
{
  this->GeneratorTarget->CheckCxxModuleStatus(config);

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetImplFileStream(fileConfig));
  this->GetImplFileStream(fileConfig)
    << "# Object build statements for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";

  std::vector<cmCustomCommand const*> customCommands;
  {
    std::vector<cmSourceFile const*> customCommandSources;
    this->GeneratorTarget->GetCustomCommands(customCommandSources, config);
    for (cmSourceFile const* sf : customCommandSources) {
      cmCustomCommand const* cc = sf->GetCustomCommand();
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());
      customCommands.push_back(cc);
    }
  }
  {
    std::vector<cmSourceFile const*> headerSources;
    this->GeneratorTarget->GetHeaderSources(headerSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      headerSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  {
    std::vector<cmSourceFile const*> extraSources;
    this->GeneratorTarget->GetExtraSources(extraSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      extraSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");

    std::vector<cmSourceFile const*> externalObjects;
    this->GeneratorTarget->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* sf : externalObjects) {
      auto objectFileName = this->GetGlobalGenerator()->ExpandCFGIntDir(
        this->ConvertToNinjaPath(sf->GetFullPath()), config);
      if (!cmHasSuffix(objectFileName, pchExtension)) {
        this->Configs[config].Objects.push_back(objectFileName);
      }
    }
  }

  if (!this->GetGlobalGenerator()->SupportsCWDDepend()) {
    // Ensure that the object directory exists. If there are no objects in the
    // target (e.g., an empty `OBJECT` library), the directory is still listed
    // as an order-only depends in the build files. Alternate `ninja`
    // implementations may not allow this (such as `samu`). See #25526.
    auto const objectDir = this->GetObjectFileDir(config);
    this->EnsureDirectoryExists(objectDir);
  }

  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Order-only phony target for ", this->GetTargetName());
    build.Outputs.push_back(this->OrderDependsTargetForTarget(config));

    // Gather order-only dependencies on custom command outputs.
    std::vector<std::string> ccouts;
    std::vector<std::string> ccouts_private;
    bool usePrivateGeneratedSources = false;
    if (this->GeneratorTarget->Target->HasFileSets()) {
      switch (this->GetGeneratorTarget()->GetPolicyStatusCMP0154()) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::NEW:
          usePrivateGeneratedSources = true;
          break;
      }
    }
    for (cmCustomCommand const* cc : customCommands) {
      cmCustomCommandGenerator ccg(*cc, config, this->GetLocalGenerator());
      const std::vector<std::string>& ccoutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccbyproducts = ccg.GetByproducts();
      auto const nPreviousOutputs = ccouts.size();
      ccouts.insert(ccouts.end(), ccoutputs.begin(), ccoutputs.end());
      ccouts.insert(ccouts.end(), ccbyproducts.begin(), ccbyproducts.end());
      if (usePrivateGeneratedSources) {
        auto it = ccouts.begin();
        // Skip over outputs that were already detected.
        std::advance(it, nPreviousOutputs);
        while (it != ccouts.end()) {
          cmFileSet const* fileset =
            this->GeneratorTarget->GetFileSetForSource(
              config, this->Makefile->GetOrCreateGeneratedSource(*it));
          bool isVisible = fileset &&
            cmFileSetVisibilityIsForInterface(fileset->GetVisibility());
          bool isIncludeable =
            !fileset || cmFileSetTypeCanBeIncluded(fileset->GetType());
          if (fileset && isVisible && isIncludeable) {
            ++it;
            continue;
          }
          if (!fileset || isIncludeable) {
            ccouts_private.push_back(*it);
          }
          it = ccouts.erase(it);
        }
      }
    }

    cmNinjaDeps& orderOnlyDeps = build.OrderOnlyDeps;
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, orderOnlyDeps, config, fileConfig,
      DependOnTargetOrdering);

    // Add order-only dependencies on other files associated with the target.
    cm::append(orderOnlyDeps, this->Configs[config].ExtraFiles);

    // Add order-only dependencies on custom command outputs.
    std::transform(ccouts.begin(), ccouts.end(),
                   std::back_inserter(orderOnlyDeps), this->MapToNinjaPath());

    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    orderOnlyDeps.erase(
      std::unique(orderOnlyDeps.begin(), orderOnlyDeps.end()),
      orderOnlyDeps.end());

    // The phony target must depend on at least one input or ninja will explain
    // that "output ... of phony edge with no inputs doesn't exist" and
    // consider the phony output "dirty".
    if (orderOnlyDeps.empty()) {
      std::string tgtDir;
      if (this->GetGlobalGenerator()->SupportsCWDDepend()) {
        tgtDir = ".";
      } else {
        // Any path that always exists will work here.
        tgtDir = cmStrCat(
          this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
          this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
      }
      orderOnlyDeps.push_back(this->ConvertToNinjaPath(tgtDir));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);

    // Add order-only dependencies on custom command outputs that are
    // private to this target.
    this->HasPrivateGeneratedSources = !ccouts_private.empty();
    if (this->HasPrivateGeneratedSources) {
      cmNinjaBuild buildPrivate("phony");
      cmNinjaDeps& orderOnlyDepsPrivate = buildPrivate.OrderOnlyDeps;
      orderOnlyDepsPrivate.push_back(
        this->OrderDependsTargetForTarget(config));

      buildPrivate.Outputs.push_back(
        this->OrderDependsTargetForTargetPrivate(config));

      std::transform(ccouts_private.begin(), ccouts_private.end(),
                     std::back_inserter(orderOnlyDepsPrivate),
                     this->MapToNinjaPath());

      std::sort(orderOnlyDepsPrivate.begin(), orderOnlyDepsPrivate.end());
      orderOnlyDepsPrivate.erase(
        std::unique(orderOnlyDepsPrivate.begin(), orderOnlyDepsPrivate.end()),
        orderOnlyDepsPrivate.end());

      this->GetGlobalGenerator()->WriteBuild(
        this->GetImplFileStream(fileConfig), buildPrivate);
    }
  }
  {
    std::vector<cmSourceFile const*> objectSources;
    this->GeneratorTarget->GetObjectSources(objectSources, config);

    std::vector<cmSourceFile const*> swiftSources;

    for (cmSourceFile const* sf : objectSources) {
      if (this->GetLocalGenerator()->IsSplitSwiftBuild() &&
          sf->GetLanguage() == "Swift") {
        swiftSources.push_back(sf);
      } else {
        this->WriteObjectBuildStatement(sf, config, fileConfig,
                                        firstForConfig);
      }
    }
    WriteSwiftObjectBuildStatement(swiftSources, config, fileConfig,
                                   firstForConfig);
  }

  {
    std::vector<cmSourceFile const*> bmiOnlySources;
    this->GeneratorTarget->GetCxxModuleSources(bmiOnlySources, config);

    for (cmSourceFile const* sf : bmiOnlySources) {
      this->WriteCxxModuleBmiBuildStatement(sf, config, fileConfig,
                                            firstForConfig);
    }
  }

  // Detect sources in `CXX_MODULES` which are not compiled.
  {
    std::vector<cmSourceFile*> sources;
    this->GeneratorTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* sf : sources) {
      cmFileSet const* fs =
        this->GeneratorTarget->GetFileSetForSource(config, sf);
      if (!fs) {
        continue;
      }
      if (fs->GetType() != "CXX_MODULES"_s) {
        continue;
      }
      if (sf->GetLanguage().empty()) {
        this->GeneratorTarget->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Target \"", this->GeneratorTarget->GetName(),
                   "\" has source file\n  ", sf->GetFullPath(),
                   "\nin a \"FILE_SET TYPE CXX_MODULES\" but it is not "
                   "scheduled for compilation."));
      }
    }
  }

  // Check if there are Fortran objects which need to participate in forwarding
  // module requirements.
  if (this->GeneratorTarget->HaveFortranSources(config) &&
      !this->Configs[config].ScanningInfo.count("Fortran")) {
    ScanningFiles files;
    this->Configs[config].ScanningInfo["Fortran"].emplace_back(files);
    this->WriteCompileRule("Fortran", config, WithScanning::Yes);
  }

  for (auto const& langScanningFiles : this->Configs[config].ScanningInfo) {
    std::string const& language = langScanningFiles.first;
    std::vector<ScanningFiles> const& scanningFiles = langScanningFiles.second;

    cmNinjaBuild build(this->LanguageDyndepRule(language, config));
    build.Outputs.push_back(this->GetDyndepFilePath(language, config));
    build.ImplicitOuts.emplace_back(
      cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               this->GetGlobalGenerator()->ConfigDirectory(config), '/',
               language, "Modules.json"));
    build.ImplicitDeps.emplace_back(
      this->GetTargetDependInfoPath(language, config));
    for (auto const& scanFiles : scanningFiles) {
      if (!scanFiles.ScanningOutput.empty()) {
        build.ExplicitDeps.push_back(scanFiles.ScanningOutput);
      }
      if (!scanFiles.ModuleMapFile.empty()) {
        build.ImplicitOuts.push_back(scanFiles.ModuleMapFile);
      }
    }

    this->WriteTargetDependInfo(language, config);

    auto const linked_directories =
      this->GetLinkedTargetDirectories(language, config);
    for (std::string const& l : linked_directories.Direct) {
      build.ImplicitDeps.emplace_back(
        cmStrCat(l, '/', language, "Modules.json"));
    }
    for (std::string const& l : linked_directories.Forward) {
      build.ImplicitDeps.emplace_back(
        cmStrCat(l, '/', language, "Modules.json"));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);
  }

  this->GetImplFileStream(fileConfig) << "\n";
}